

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void av1_decode_tg_tiles_and_wrapup
               (AV1Decoder *pbi,uint8_t *data,uint8_t *data_end,uint8_t **p_data_end,int start_tile,
               int end_tile,int initialize_flag)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  AVxWorkerImpl *pAVar7;
  AVxWorker *in_RCX;
  int in_EDX;
  AV1LfSync *in_RSI;
  AV1_COMMON *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_0000000c;
  AV1CdefSync *in_stack_00000010;
  AV1CdefWorkerData **in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000024;
  uint8_t *in_stack_00000028;
  int do_extend_border_mt;
  int do_loop_restoration;
  int optimized_loop_restoration;
  int do_superres;
  int do_cdef;
  int num_planes;
  int tile_count_tg;
  MACROBLOCKD *xd;
  CommonTileParams *tiles;
  AV1_COMMON *cm;
  FRAME_CONTEXT *in_stack_00000430;
  AV1CdefSync *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  AV1_COMMON *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffffa0;
  undefined1 uVar8;
  undefined1 in_stack_ffffffffffffffa1;
  byte bVar9;
  undefined1 in_stack_ffffffffffffffa2;
  undefined1 in_stack_ffffffffffffffa3;
  undefined1 uVar10;
  undefined4 in_stack_ffffffffffffffa4;
  int optimized_lr;
  int iVar11;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  YV12_BUFFER_CONFIG *frame;
  AV1_COMMON *cm_00;
  AV1_COMMON *pAVar12;
  
  cm_00 = (AV1_COMMON *)((in_RDI->quant_params).gqmatrix[0xf][2] + 2);
  frame = (YV12_BUFFER_CONFIG *)(in_RDI[1].quant_params.gqmatrix[0xe][0] + 1);
  iVar1 = (in_R9D - in_R8D) + 1;
  (in_RDI->quant_params).gqmatrix[5][2][0xe] = (in_RDI->quant_params).gqmatrix[0xf][2][8];
  pAVar12 = in_RDI;
  if (in_stack_00000008 != 0) {
    setup_frame_info((AV1Decoder *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  iVar2 = av1_num_planes(cm_00);
  if ((*(int *)(pAVar12[0xe].quant_params.giqmatrix[0xd][1] + 4) < 2) ||
     (((frame[2].matrix_coefficients != AOM_CICP_MC_IDENTITY &&
       (*(int *)(pAVar12[0xe].quant_params.giqmatrix[0xd][1] + 0x11) == 0)) ||
      (*(int *)((long)pAVar12[0xe].quant_params.giqmatrix[0xd][1] + 0x8c) == 0)))) {
    if (((*(int *)(pAVar12[0xe].quant_params.giqmatrix[0xd][1] + 4) < 2) || (iVar1 < 2)) ||
       ((frame[2].matrix_coefficients != AOM_CICP_MC_IDENTITY &&
        (*(int *)(pAVar12[0xe].quant_params.giqmatrix[0xd][1] + 0x11) == 0)))) {
      pAVar7 = (AVxWorkerImpl *)
               decode_tiles((AV1Decoder *)cm,(uint8_t *)CONCAT44(tiles._4_4_,(int)tiles),
                            (uint8_t *)CONCAT44(xd._4_4_,xd._0_4_),tile_count_tg,num_planes);
      in_RCX->impl_ = pAVar7;
    }
    else {
      pAVar7 = (AVxWorkerImpl *)
               decode_tiles_mt(_do_superres,_do_loop_restoration,in_stack_00000028,in_stack_00000024
                               ,in_stack_00000020);
      in_RCX->impl_ = pAVar7;
    }
  }
  else {
    pAVar7 = (AVxWorkerImpl *)
             decode_tiles_row_mt((AV1Decoder *)p_data_end,(uint8_t *)CONCAT44(start_tile,end_tile),
                                 (uint8_t *)cm,tiles._4_4_,(int)tiles);
    in_RCX->impl_ = pAVar7;
  }
  if (iVar2 < 3) {
    set_planes_to_neutral_grey
              ((SequenceHeader *)
               CONCAT44(in_stack_ffffffffffffffa4,
                        CONCAT13(in_stack_ffffffffffffffa3,
                                 CONCAT12(in_stack_ffffffffffffffa2,
                                          CONCAT11(in_stack_ffffffffffffffa1,
                                                   in_stack_ffffffffffffffa0)))),
               (YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffff94);
  }
  if (in_R9D == (frame->field_0).field_0.uv_width * (frame->field_0).field_0.y_width + -1) {
    av1_alloc_cdef_buffers
              ((AV1_COMMON *)CONCAT44(in_stack_00000024,in_stack_00000020),in_stack_00000018,
               in_stack_00000010,in_stack_0000000c,in_stack_00000008);
    av1_alloc_cdef_sync((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78,0);
    if ((((cm_00->features).allow_intrabc & 1U) == 0) && (*(int *)&frame[2].monochrome == 0)) {
      if (((cm_00->lf).filter_level[0] != 0) || ((cm_00->lf).filter_level[1] != 0)) {
        in_stack_ffffffffffffff80 = *(int *)(pAVar12[1].quant_params.y_iqmatrix[2] + 0xe);
        in_stack_ffffffffffffff88 = (AV1_COMMON *)(pAVar12[1].quant_params.gqmatrix[0xf][2] + 9);
        in_stack_ffffffffffffff90 = 0;
        av1_loop_filter_frame_mt
                  (frame,in_RDI,(MACROBLOCKD *)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffb4,
                   in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_RCX,in_EDX,in_RSI,
                   (int)pAVar12);
      }
      uVar10 = false;
      if ((((*(int *)((long)pAVar12[0xf].quant_params.gqmatrix[0][2] + 0x2c) == 0) &&
           (uVar10 = false, ((cm_00->features).coded_lossless & 1U) == 0)) &&
          (in_stack_ffffffffffffffa2 = true, uVar10 = in_stack_ffffffffffffffa2,
          (cm_00->cdef_info).cdef_bits == 0)) &&
         (in_stack_ffffffffffffffa2 = true, uVar10 = in_stack_ffffffffffffffa2,
         (cm_00->cdef_info).cdef_strengths[0] == 0)) {
        in_stack_ffffffffffffffa2 = (cm_00->cdef_info).cdef_uv_strengths[0] != 0;
        uVar10 = in_stack_ffffffffffffffa2;
      }
      uVar3 = (uint)(byte)uVar10;
      iVar4 = av1_superres_scaled(cm_00);
      bVar9 = 0;
      if (uVar3 == 0) {
        bVar9 = iVar4 != 0 ^ 0xff;
      }
      uVar5 = (uint)(bVar9 & 1);
      uVar8 = true;
      if ((cm_00->rst_info[0].frame_restoration_type == RESTORE_NONE) &&
         (uVar8 = true, cm_00->rst_info[1].frame_restoration_type == RESTORE_NONE)) {
        uVar8 = cm_00->rst_info[2].frame_restoration_type != RESTORE_NONE;
      }
      uVar6 = (uint)(byte)uVar8;
      optimized_lr = 0;
      if (uVar5 == 0) {
        if (uVar6 != 0) {
          av1_loop_restoration_save_boundary_lines
                    ((YV12_BUFFER_CONFIG *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
        }
        if (uVar3 != 0) {
          if (*(int *)(pAVar12[1].quant_params.y_iqmatrix[2] + 0xe) < 2) {
            av1_cdef_frame((YV12_BUFFER_CONFIG *)CONCAT44(uVar3,iVar4),
                           (AV1_COMMON *)CONCAT44(uVar5,uVar6),
                           (MACROBLOCKD *)
                           CONCAT44(optimized_lr,
                                    CONCAT13(uVar10,CONCAT12(in_stack_ffffffffffffffa2,
                                                             CONCAT11(bVar9,uVar8)))),
                           (cdef_init_fb_row_t)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
          }
          else {
            iVar11 = optimized_lr;
            av1_cdef_frame_mt(in_RDI,(MACROBLOCKD *)CONCAT44(iVar1,iVar2),
                              (AV1CdefWorkerData *)CONCAT44(uVar3,iVar4),
                              (AVxWorker *)CONCAT44(uVar5,uVar6),
                              (AV1CdefSync *)
                              CONCAT44(optimized_lr,
                                       CONCAT13(uVar10,CONCAT12(in_stack_ffffffffffffffa2,
                                                                CONCAT11(bVar9,uVar8)))),
                              in_stack_ffffffffffffff9c,(cdef_init_fb_row_t)cm_00,in_R9D);
            in_stack_ffffffffffffff80 = optimized_lr;
            optimized_lr = iVar11;
          }
        }
        superres_post_decode
                  ((AV1Decoder *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        if (uVar6 != 0) {
          av1_loop_restoration_save_boundary_lines
                    ((YV12_BUFFER_CONFIG *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
          if (*(int *)(pAVar12[1].quant_params.y_iqmatrix[2] + 0xe) < 2) {
            av1_loop_restoration_filter_frame
                      ((YV12_BUFFER_CONFIG *)
                       CONCAT44(optimized_lr,
                                CONCAT13(uVar10,CONCAT12(in_stack_ffffffffffffffa2,
                                                         CONCAT11(bVar9,uVar8)))),
                       (AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
          }
          else {
            av1_loop_restoration_filter_frame_mt
                      ((YV12_BUFFER_CONFIG *)CONCAT44(uVar3,iVar4),
                       (AV1_COMMON *)CONCAT44(uVar5,uVar6),optimized_lr,
                       (AVxWorker *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffff94,(AV1LrSync *)in_stack_ffffffffffffff88,in_RDI,
                       (int)frame);
          }
        }
      }
      else if (uVar6 != 0) {
        if (*(int *)(pAVar12[1].quant_params.y_iqmatrix[2] + 0xe) < 2) {
          av1_loop_restoration_filter_frame
                    ((YV12_BUFFER_CONFIG *)
                     (ulong)CONCAT13(uVar10,CONCAT12(in_stack_ffffffffffffffa2,CONCAT11(bVar9,uVar8)
                                                    )),
                     (AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
        }
        else {
          av1_loop_restoration_filter_frame_mt
                    ((YV12_BUFFER_CONFIG *)CONCAT44(uVar3,iVar4),
                     (AV1_COMMON *)(ulong)(CONCAT14(bVar9,uVar6) & 0x1ffffffff),0,
                     (AVxWorker *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     in_stack_ffffffffffffff94,(AV1LrSync *)in_stack_ffffffffffffff88,in_RDI,
                     (int)frame);
        }
      }
    }
    if (*(int *)((pAVar12->quant_params).gqmatrix[0xf][1] + 3) == 0) {
      if ((cm_00->features).refresh_frame_context == '\x01') {
        memcpy(cm_00->fc,
               pAVar12[0xb].quant_params.u_iqmatrix[7][0xe] +
               (long)*(int *)(pAVar12[0xf].quant_params.gqmatrix[0][2] + 5) * 0x53a0 + 0x60,0x52fc);
        av1_reset_cdf_symbol_counters(in_stack_00000430);
      }
    }
    else {
      aom_internal_error((aom_internal_error_info *)(pAVar12[0xf].quant_params.gqmatrix[5][0] + 0xb)
                         ,AOM_CODEC_CORRUPT_FRAME,"Decode failed. Frame data is corrupted.");
    }
    if (frame[2].matrix_coefficients == AOM_CICP_MC_IDENTITY) {
      memcpy(&cm_00->cur_frame->frame_context,cm_00->fc,0x52fc);
    }
    if ((cm_00->show_frame != 0) && ((cm_00->seq_params->order_hint_info).enable_order_hint == 0)) {
      (cm_00->current_frame).frame_number = (cm_00->current_frame).frame_number + 1;
    }
  }
  return;
}

Assistant:

void av1_decode_tg_tiles_and_wrapup(AV1Decoder *pbi, const uint8_t *data,
                                    const uint8_t *data_end,
                                    const uint8_t **p_data_end, int start_tile,
                                    int end_tile, int initialize_flag) {
  AV1_COMMON *const cm = &pbi->common;
  CommonTileParams *const tiles = &cm->tiles;
  MACROBLOCKD *const xd = &pbi->dcb.xd;
  const int tile_count_tg = end_tile - start_tile + 1;

  xd->error_info = cm->error;
  if (initialize_flag) setup_frame_info(pbi);
  const int num_planes = av1_num_planes(cm);

  if (pbi->max_threads > 1 && !(tiles->large_scale && !pbi->ext_tile_debug) &&
      pbi->row_mt)
    *p_data_end =
        decode_tiles_row_mt(pbi, data, data_end, start_tile, end_tile);
  else if (pbi->max_threads > 1 && tile_count_tg > 1 &&
           !(tiles->large_scale && !pbi->ext_tile_debug))
    *p_data_end = decode_tiles_mt(pbi, data, data_end, start_tile, end_tile);
  else
    *p_data_end = decode_tiles(pbi, data, data_end, start_tile, end_tile);

  // If the bit stream is monochrome, set the U and V buffers to a constant.
  if (num_planes < 3) {
    set_planes_to_neutral_grey(cm->seq_params, xd->cur_buf, 1);
  }

  if (end_tile != tiles->rows * tiles->cols - 1) {
    return;
  }

  av1_alloc_cdef_buffers(cm, &pbi->cdef_worker, &pbi->cdef_sync,
                         pbi->num_workers, 1);
  av1_alloc_cdef_sync(cm, &pbi->cdef_sync, pbi->num_workers);

  if (!cm->features.allow_intrabc && !tiles->single_tile_decoding) {
    if (cm->lf.filter_level[0] || cm->lf.filter_level[1]) {
      av1_loop_filter_frame_mt(&cm->cur_frame->buf, cm, &pbi->dcb.xd, 0,
                               num_planes, 0, pbi->tile_workers,
                               pbi->num_workers, &pbi->lf_row_sync, 0);
    }

    const int do_cdef =
        !pbi->skip_loop_filter && !cm->features.coded_lossless &&
        (cm->cdef_info.cdef_bits || cm->cdef_info.cdef_strengths[0] ||
         cm->cdef_info.cdef_uv_strengths[0]);
    const int do_superres = av1_superres_scaled(cm);
    const int optimized_loop_restoration = !do_cdef && !do_superres;
    const int do_loop_restoration =
        cm->rst_info[0].frame_restoration_type != RESTORE_NONE ||
        cm->rst_info[1].frame_restoration_type != RESTORE_NONE ||
        cm->rst_info[2].frame_restoration_type != RESTORE_NONE;
    // Frame border extension is not required in the decoder
    // as it happens in extend_mc_border().
    int do_extend_border_mt = 0;
    if (!optimized_loop_restoration) {
      if (do_loop_restoration)
        av1_loop_restoration_save_boundary_lines(&pbi->common.cur_frame->buf,
                                                 cm, 0);

      if (do_cdef) {
        if (pbi->num_workers > 1) {
          av1_cdef_frame_mt(cm, &pbi->dcb.xd, pbi->cdef_worker,
                            pbi->tile_workers, &pbi->cdef_sync,
                            pbi->num_workers, av1_cdef_init_fb_row_mt,
                            do_extend_border_mt);
        } else {
          av1_cdef_frame(&pbi->common.cur_frame->buf, cm, &pbi->dcb.xd,
                         av1_cdef_init_fb_row);
        }
      }

      superres_post_decode(pbi);

      if (do_loop_restoration) {
        av1_loop_restoration_save_boundary_lines(&pbi->common.cur_frame->buf,
                                                 cm, 1);
        if (pbi->num_workers > 1) {
          av1_loop_restoration_filter_frame_mt(
              (YV12_BUFFER_CONFIG *)xd->cur_buf, cm, optimized_loop_restoration,
              pbi->tile_workers, pbi->num_workers, &pbi->lr_row_sync,
              &pbi->lr_ctxt, do_extend_border_mt);
        } else {
          av1_loop_restoration_filter_frame((YV12_BUFFER_CONFIG *)xd->cur_buf,
                                            cm, optimized_loop_restoration,
                                            &pbi->lr_ctxt);
        }
      }
    } else {
      // In no cdef and no superres case. Provide an optimized version of
      // loop_restoration_filter.
      if (do_loop_restoration) {
        if (pbi->num_workers > 1) {
          av1_loop_restoration_filter_frame_mt(
              (YV12_BUFFER_CONFIG *)xd->cur_buf, cm, optimized_loop_restoration,
              pbi->tile_workers, pbi->num_workers, &pbi->lr_row_sync,
              &pbi->lr_ctxt, do_extend_border_mt);
        } else {
          av1_loop_restoration_filter_frame((YV12_BUFFER_CONFIG *)xd->cur_buf,
                                            cm, optimized_loop_restoration,
                                            &pbi->lr_ctxt);
        }
      }
    }
  }

  if (!pbi->dcb.corrupted) {
    if (cm->features.refresh_frame_context == REFRESH_FRAME_CONTEXT_BACKWARD) {
      assert(pbi->context_update_tile_id < pbi->allocated_tiles);
      *cm->fc = pbi->tile_data[pbi->context_update_tile_id].tctx;
      av1_reset_cdf_symbol_counters(cm->fc);
    }
  } else {
    aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                       "Decode failed. Frame data is corrupted.");
  }

#if CONFIG_INSPECTION
  if (pbi->inspect_cb != NULL) {
    (*pbi->inspect_cb)(pbi, pbi->inspect_ctx);
  }
#endif

  // Non frame parallel update frame context here.
  if (!tiles->large_scale) {
    cm->cur_frame->frame_context = *cm->fc;
  }

  if (cm->show_frame && !cm->seq_params->order_hint_info.enable_order_hint) {
    ++cm->current_frame.frame_number;
  }
}